

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fIntegerStateQueryTests.cpp
# Opt level: O3

void __thiscall
deqp::gles2::Functional::IntegerStateQueryVerifiers::GetBooleanVerifier::
verifyIntegerGreaterOrEqual2
          (GetBooleanVerifier *this,TestContext *testCtx,GLenum name,GLint reference0,
          GLint reference1)

{
  bool bVar1;
  bool *pbVar2;
  long lVar3;
  bool bVar4;
  StateQueryMemoryWriteGuard<unsigned_char[2]> boolVector;
  bool local_1b8;
  bool local_1b7;
  StateQueryMemoryWriteGuard<unsigned_char[2]> local_1b6;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  local_1b6.m_preguard[0] = 0xde;
  local_1b6.m_preguard[1] = 0xde;
  local_1b6.m_value[0] = 0xde;
  local_1b6.m_value[1] = 0xde;
  local_1b6.m_postguard[0] = 0xde;
  local_1b6.m_postguard[1] = 0xde;
  glu::CallLogWrapper::glGetBooleanv
            (&(this->super_StateVerifier).super_CallLogWrapper,name,local_1b6.m_value);
  bVar1 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<unsigned_char[2]>::verifyValidity
                    (&local_1b6,testCtx);
  if (bVar1) {
    local_1b7 = reference0 != 0;
    local_1b8 = reference1 != 0;
    lVar3 = 0;
    pbVar2 = &local_1b7;
    bVar1 = true;
    do {
      bVar4 = bVar1;
      if (local_1b6.m_value[lVar3] != '\x01') {
        if (local_1b6.m_value[lVar3] == '\0') {
          if (*pbVar2 == false) goto LAB_00f9434b;
          local_1b0._0_8_ = testCtx->m_log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_1b0 + 8),"// ERROR: expected GL_TRUE",0x1a);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        }
        else {
          local_1b0._0_8_ = testCtx->m_log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_1b0 + 8),"// ERROR: expected GL_TRUE or GL_FALSE",0x26);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
        std::ios_base::~ios_base(local_138);
        if (testCtx->m_testResult == QP_TEST_RESULT_PASS) {
          tcu::TestContext::setTestResult(testCtx,QP_TEST_RESULT_FAIL,"Got invalid boolean value");
        }
      }
LAB_00f9434b:
      lVar3 = 1;
      pbVar2 = &local_1b8;
      bVar1 = false;
    } while (bVar4);
  }
  return;
}

Assistant:

void GetBooleanVerifier::verifyIntegerGreaterOrEqual2 (tcu::TestContext& testCtx, GLenum name, GLint reference0, GLint reference1)
{
	using tcu::TestLog;

	StateQueryMemoryWriteGuard<GLboolean[2]> boolVector;
	glGetBooleanv(name, boolVector);

	if (!boolVector.verifyValidity(testCtx))
		return;

	const GLboolean referenceAsGLBoolean[2] =
	{
		reference0 ? (GLboolean)GL_TRUE : (GLboolean)GL_FALSE,
		reference1 ? (GLboolean)GL_TRUE : (GLboolean)GL_FALSE
	};

	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(referenceAsGLBoolean); ++ndx)
	{
		if (boolVector[ndx] == GL_TRUE) // state is non-zero, could be greater than any integer
		{
			continue;
		}
		else if (boolVector[ndx] == GL_FALSE) // state is zero
		{
			if (referenceAsGLBoolean[ndx] > 0) // and reference is greater than zero?
			{
				testCtx.getLog() << TestLog::Message << "// ERROR: expected GL_TRUE" << TestLog::EndMessage;
				if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
					testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid boolean value");
			}
		}
		else
		{
			testCtx.getLog() << TestLog::Message << "// ERROR: expected GL_TRUE or GL_FALSE" << TestLog::EndMessage;
			if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
				testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid boolean value");
		}
	}
}